

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

int __thiscall
GEO::geofile::import_point
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number)

{
  bool bVar1;
  ostream *poVar2;
  pointer pbVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  pair<const_int,_GEO::point> local_58;
  
  pbVar3 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar1 = is_integer(pbVar3 + 1);
  if ((((bVar1) && (bVar1 = is_e_notation(pbVar3 + 2), bVar1)) &&
      (bVar1 = is_e_notation(pbVar3 + 3), bVar1)) && (bVar1 = is_e_notation(pbVar3 + 4), bVar1)) {
    bVar1 = is_e_notation(pbVar3 + 5);
    if (bVar1) goto LAB_00122909;
    bVar1 = std::operator==(pbVar3 + 5,"MeshSpac");
    pbVar3 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (bVar1) goto LAB_00122909;
    bVar1 = std::operator==(pbVar3 + 5,"cl__1");
    pbVar3 = (split_string_vector->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (bVar1) goto LAB_00122909;
  }
  bVar1 = std::operator==(pbVar3 + 5,";");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: Invalid value (line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*line_number);
    poVar2 = std::operator<<(poVar2," of ");
    poVar2 = std::operator<<(poVar2,(string *)import_path);
    poVar2 = std::operator<<(poVar2,")");
    std::endl<char,std::char_traits<char>>(poVar2);
    return 1;
  }
  pbVar3 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
LAB_00122909:
  dVar4 = std::__cxx11::stod(pbVar3 + 2,(size_t *)0x0);
  dVar5 = std::__cxx11::stod((split_string_vector->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0);
  dVar6 = std::__cxx11::stod((split_string_vector->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 4,(size_t *)0x0);
  bVar1 = std::operator==((split_string_vector->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 5,"MeshSpac");
  if ((bVar1) ||
     (bVar1 = std::operator==((split_string_vector->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 5,"cl__1"), bVar1)) {
    dVar7 = this->mesh_spacing;
  }
  else {
    bVar1 = std::operator!=((split_string_vector->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 5,";");
    dVar7 = 0.0;
    if (bVar1) {
      dVar7 = std::__cxx11::stod((split_string_vector->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 5,(size_t *)0x0);
    }
  }
  local_58.first =
       std::__cxx11::stoi((split_string_vector->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
  local_58.second.x = dVar4;
  local_58.second.y = dVar5;
  local_58.second.z = dVar6;
  local_58.second.char_len = dVar7;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&this->points_map,&local_58);
  return 0;
}

Assistant:

int GEO::geofile::import_point( std::vector<std::string> &split_string_vector,
                                std::string &import_path,
                                int &line_number)
{
    if ( (is_integer(split_string_vector[1])==true)&&
         (is_e_notation(split_string_vector[2])==true)&&
         (is_e_notation(split_string_vector[3])==true)&&
         (is_e_notation(split_string_vector[4])==true)&&
         ( (is_e_notation(split_string_vector[5])==true)||
           (split_string_vector[5]=="MeshSpac")||
           (split_string_vector[5]=="cl__1") )||
           (split_string_vector[5]==";") )
    {
        point input_point;
        input_point.x = std::stod(split_string_vector[2]);
        input_point.y = std::stod(split_string_vector[3]);
        input_point.z = std::stod(split_string_vector[4]);
        if( (split_string_vector[5]=="MeshSpac")||
            (split_string_vector[5]=="cl__1") )
        {
            input_point.char_len = mesh_spacing;
        }
        else
        {
            if (split_string_vector[5]!=";")
                input_point.char_len = std::stod(split_string_vector[5]);
            else
                input_point.char_len = 0;
        }
        points_map.insert({std::stoi(split_string_vector[1]), input_point});
        return EXIT_SUCCESS;
    }
    else
    {
        std::cout << "Error: Invalid value (line "
        << line_number << " of "
        << import_path << ")" << std::endl;
        return EXIT_FAILURE;
    }
}